

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_CCtx_setCParams(ZSTD_CCtx *cctx,ZSTD_compressionParameters cparams)

{
  ZSTD_cStreamStage ZVar1;
  ulong uVar2;
  undefined4 in_R8D;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  uint in_stack_00000008;
  uint in_stack_0000000c;
  
  uVar5 = in_stack_00000008 - 0x20 ^ 0x80000000;
  auVar6._0_4_ = -(uint)(0x7fffffe9 < (int)uVar5);
  auVar6._4_4_ = -(uint)(0x7fffffe6 < (int)(in_stack_0000000c - 0x1f ^ 0x80000000));
  auVar6._8_4_ = -(uint)(0x7fffffe6 < (int)(cparams.windowLog - 0x1f ^ 0x80000000));
  auVar6._12_4_ = -(uint)(0x7fffffe1 < (int)(cparams.chainLog - 0x1f ^ 0x80000000));
  iVar3 = movmskps(in_R8D,auVar6);
  uVar4 = 0xffffffffffffffd6;
  if ((iVar3 == 0xf) && (cparams.searchLog < 0x20001 && 0xfffffffa < cparams.hashLog - 8)) {
    uVar4 = 0xffffffffffffffd6;
    if (0xfffffff6 < cparams.minMatch - 10) {
      uVar4 = 0;
    }
  }
  if (uVar4 < 0xffffffffffffff89) {
    ZVar1 = cctx->streamStage;
    uVar4 = 0xffffffffffffffc4;
    if ((ZVar1 == zcss_init) &&
       ((in_stack_00000008 == 0 || (uVar4 = 0xffffffffffffffd6, 0x7fffffe9 < (int)uVar5)))) {
      (cctx->requestedParams).cParams.windowLog = in_stack_00000008;
      uVar4 = (ulong)in_stack_00000008;
    }
    if (uVar4 < 0xffffffffffffff89) {
      if (ZVar1 != zcss_init) {
        cctx->cParamsChanged = 1;
      }
      uVar4 = 0xffffffffffffffd6;
      if (in_stack_0000000c == 0 || 0xffffffe6 < in_stack_0000000c - 0x1f) {
        (cctx->requestedParams).cParams.chainLog = in_stack_0000000c;
        uVar4 = (ulong)in_stack_0000000c;
      }
      if (uVar4 < 0xffffffffffffff89) {
        if (ZVar1 != zcss_init) {
          cctx->cParamsChanged = 1;
        }
        uVar4 = 0xffffffffffffffd6;
        if (cparams.windowLog == 0 || 0xffffffe6 < cparams.windowLog - 0x1f) {
          (cctx->requestedParams).cParams.hashLog = cparams.windowLog;
          uVar4 = (ulong)cparams.windowLog;
        }
        if (uVar4 < 0xffffffffffffff89) {
          if (ZVar1 != zcss_init) {
            cctx->cParamsChanged = 1;
          }
          uVar4 = 0xffffffffffffffd6;
          if (cparams.chainLog < 0x1f) {
            (cctx->requestedParams).cParams.searchLog = cparams.chainLog;
            uVar4 = (ulong)cparams.chainLog;
          }
          if (uVar4 < 0xffffffffffffff89) {
            if (ZVar1 != zcss_init) {
              cctx->cParamsChanged = 1;
            }
            if ((cparams.hashLog - 3 < 5) || (uVar4 = 0xffffffffffffffd6, cparams.hashLog == 0)) {
              (cctx->requestedParams).cParams.minMatch = cparams.hashLog;
              uVar4 = (ulong)cparams.hashLog;
            }
            if (uVar4 < 0xffffffffffffff89) {
              if (ZVar1 != zcss_init) {
                cctx->cParamsChanged = 1;
              }
              uVar4 = 0xffffffffffffffd6;
              if (cparams.searchLog < 0x20001) {
                (cctx->requestedParams).cParams.targetLength = cparams.searchLog;
                uVar4 = (ulong)cparams.searchLog;
              }
              if (uVar4 < 0xffffffffffffff89) {
                if (ZVar1 != zcss_init) {
                  cctx->cParamsChanged = 1;
                }
                uVar2 = 0xffffffffffffffd6;
                if (cparams.minMatch < 10) {
                  (cctx->requestedParams).cParams.strategy = cparams.minMatch;
                  uVar2 = (ulong)cparams.minMatch;
                }
                uVar4 = 0;
                if (0xffffffffffffff88 < uVar2) {
                  uVar4 = uVar2;
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar4;
}

Assistant:

size_t ZSTD_CCtx_setCParams(ZSTD_CCtx* cctx, ZSTD_compressionParameters cparams)
{
    ZSTD_STATIC_ASSERT(sizeof(cparams) == 7 * 4 /* all params are listed below */);
    DEBUGLOG(4, "ZSTD_CCtx_setCParams");
    /* only update if all parameters are valid */
    FORWARD_IF_ERROR(ZSTD_checkCParams(cparams), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_windowLog, cparams.windowLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_chainLog, cparams.chainLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_hashLog, cparams.hashLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_searchLog, cparams.searchLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_minMatch, cparams.minMatch), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_targetLength, cparams.targetLength), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_strategy, cparams.strategy), "");
    return 0;
}